

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall TPZMatrix<Fad<float>_>::Decompose_LDLt(TPZMatrix<Fad<float>_> *this)

{
  byte bVar1;
  ulong uVar2;
  float *pfVar3;
  int k;
  float *pfVar4;
  long lVar5;
  float fVar6;
  Fad<float> sum_1;
  long local_130;
  undefined1 local_120 [16];
  float *local_110;
  float *local_108;
  undefined1 local_100 [32];
  Fad<float> tmp;
  Fad<float> sum;
  Fad<float> *local_a0;
  Fad<float> *local_98;
  Fad<float> val;
  undefined1 *local_70;
  Fad<float> *local_68;
  Fad<float> local_50;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (bVar1 != 0) {
    if (bVar1 == 4) {
      return (uint)bVar1;
    }
    Error("Decompose_LDLt <Matrix already Decomposed with other scheme> ",(char *)0x0);
  }
  uVar2 = (this->super_TPZBaseMatrix).fRow;
  if (uVar2 != (this->super_TPZBaseMatrix).fCol) {
    Error("Decompose_LDLt <Matrix must be square>",(char *)0x0);
    uVar2 = (this->super_TPZBaseMatrix).fRow;
  }
  local_110 = (float *)0x0;
  if (0 < (int)uVar2) {
    local_110 = (float *)(uVar2 & 0xffffffff);
  }
  local_130 = 1;
  pfVar3 = (float *)0x0;
  while (pfVar3 != local_110) {
    sum.val_ = 0.0;
    sum.dx_.num_elts = 0;
    sum.dx_.ptr_to_data = (float *)0x0;
    sum.defaultVal = 0.0;
    for (pfVar4 = (float *)0x0; pfVar3 != pfVar4; pfVar4 = (float *)((long)pfVar4 + 1)) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&tmp,this,pfVar4,pfVar4);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&sum_1,this,pfVar4,pfVar3);
      local_100._0_8_ = &tmp;
      local_100._8_8_ = &sum_1;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&val,this,pfVar4,pfVar3);
      local_70 = local_100;
      local_68 = &val;
      Fad<float>::operator+=
                (&sum,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                       *)&local_70);
      Fad<float>::~Fad(&val);
      Fad<float>::~Fad(&sum_1);
      Fad<float>::~Fad(&tmp);
    }
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
              (&sum_1,this,pfVar3,pfVar3);
    val.dx_._0_8_ = &sum;
    val._0_8_ = &sum_1;
    Fad<float>::Fad<FadBinaryMinus<Fad<float>,Fad<float>>>
              (&tmp,(FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_> *)&val);
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,pfVar3,pfVar3,&tmp);
    Fad<float>::~Fad(&tmp);
    Fad<float>::~Fad(&sum_1);
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(&tmp,this,pfVar3,pfVar3);
    Fad<float>::Fad(&local_50,&tmp);
    fVar6 = ABS(local_50.val_);
    Fad<float>::~Fad(&local_50);
    if (fVar6 < 1e-12) {
      Error("Decompose_LDLt <Zero on diagonal>",(char *)0x0);
    }
    local_108 = (float *)((long)pfVar3 + 1);
    for (lVar5 = local_130; (int)lVar5 < (int)uVar2; lVar5 = lVar5 + 1) {
      sum_1.val_ = 0.0;
      sum_1.dx_.num_elts = 0;
      sum_1.dx_.ptr_to_data = (float *)0x0;
      sum_1.defaultVal = 0.0;
      for (pfVar4 = (float *)0x0; pfVar3 != pfVar4; pfVar4 = (float *)((long)pfVar4 + 1)) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&val,this,pfVar4,pfVar4);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  ((Fad<float> *)&local_70,this,pfVar3,pfVar4);
        local_a0 = &val;
        local_98 = (Fad<float> *)&local_70;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  ((Fad<float> *)local_100,this,lVar5,pfVar4);
        local_120._0_8_ = &local_a0;
        local_120._8_8_ = (Fad<float> *)local_100;
        Fad<float>::operator+=
                  (&sum_1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                           *)local_120);
        Fad<float>::~Fad((Fad<float> *)local_100);
        Fad<float>::~Fad((Fad<float> *)&local_70);
        Fad<float>::~Fad(&val);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                ((Fad<float> *)&local_70,this,lVar5,pfVar3);
      local_100._0_8_ = local_120;
      local_100._8_8_ = &tmp;
      local_120._0_8_ = (Fad<float> *)&local_70;
      local_120._8_8_ = &sum_1;
      Fad<float>::Fad<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<float>,Fad<float>>>,Fad<float>>>
                (&val,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                       *)local_100);
      Fad<float>::~Fad((Fad<float> *)&local_70);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,lVar5,pfVar3,&val)
      ;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,pfVar3,lVar5,&val)
      ;
      Fad<float>::~Fad(&val);
      Fad<float>::~Fad(&sum_1);
    }
    Fad<float>::~Fad(&tmp);
    Fad<float>::~Fad(&sum);
    local_130 = local_130 + 1;
    pfVar3 = local_108;
  }
  (this->super_TPZBaseMatrix).fDecomposed = '\x04';
  (this->super_TPZBaseMatrix).fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}